

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O2

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd;
  SessionHandle *data;
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  size_t len_00;
  size_t sVar4;
  char *pcVar5;
  char *newp;
  size_t sVar6;
  ssize_t amount;
  curl_off_t *local_40;
  int len;
  
  data = conn->data;
  sockfd = conn->sock[0];
  pcVar5 = (data->state).path;
  *done = true;
  sVar2 = strlen(pcVar5);
  if (sVar2 < 3) {
    pcVar3 = (char *)0x0;
    pcVar5 = "";
  }
  else {
    pcVar5 = pcVar5 + 2;
    sVar2 = strlen(pcVar5);
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      if (pcVar5[sVar4] == '?') {
        pcVar5[sVar4] = '\t';
      }
    }
    pcVar3 = curl_easy_unescape(data,pcVar5,0,&len);
    pcVar5 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  local_40 = &(data->req).bytecount;
  sVar2 = strlen(pcVar5);
  len_00 = curlx_uztosz(sVar2);
  while (CVar1 = Curl_write(conn,sockfd,pcVar5,len_00,&amount), CVar1 == CURLE_OK) {
    CVar1 = Curl_client_write(conn,2,pcVar5,amount);
    if (CVar1 != CURLE_OK) goto LAB_00444dbe;
    sVar6 = len_00 - amount;
    if (sVar6 == 0 || (long)len_00 < amount) {
      if (pcVar3 != (char *)0x0) {
        (*Curl_cfree)(pcVar3);
      }
      CVar1 = Curl_sendf(sockfd,conn,"\r\n");
      if (CVar1 != CURLE_OK) {
        Curl_failf(data,"Failed sending Gopher request");
        return CVar1;
      }
      CVar1 = Curl_client_write(conn,2,"\r\n",2);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      Curl_setup_transfer(conn,0,-1,false,local_40,-1,(curl_off_t *)0x0);
      return CURLE_OK;
    }
    pcVar5 = pcVar5 + amount;
    Curl_socket_check(-1,-1,sockfd,100);
    len_00 = sVar6;
  }
  Curl_failf(data,"Failed sending Gopher request");
LAB_00444dbe:
  if (pcVar3 != (char *)0x0) {
    (*Curl_cfree)(pcVar3);
  }
  return CVar1;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result=CURLE_OK;
  struct SessionHandle *data=conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  curl_off_t *bytecount = &data->req.bytecount;
  char *path = data->state.path;
  char *sel;
  char *sel_org = NULL;
  ssize_t amount, k;

  *done = TRUE; /* unconditionally */

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(path) <= 2)
    sel = (char *)"";
  else {
    char *newp;
    size_t j, i;
    int len;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = path;
    newp+=2;

    /* ... then turn ? into TAB for search servers, Veronica, etc. ... */
    j = strlen(newp);
    for(i=0; i<j; i++)
      if(newp[i] == '?')
        newp[i] = '\x09';

    /* ... and finally unescape */
    sel = curl_easy_unescape(data, newp, 0, &len);
    if(!sel)
      return CURLE_OUT_OF_MEMORY;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(strlen(sel));

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(CURLE_OK == result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result) {
        Curl_safefree(sel_org);
        return result;
      }
      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else {
      failf(data, "Failed sending Gopher request");
      Curl_safefree(sel_org);
      return result;
    }
    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    Curl_socket_ready(CURL_SOCKET_BAD, sockfd, 100);
  }

  Curl_safefree(sel_org);

  /* We can use Curl_sendf to send the terminal \r\n relatively safely and
     save allocing another string/doing another _write loop. */
  result = Curl_sendf(sockfd, conn, "\r\n");
  if(result != CURLE_OK) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                      -1, NULL); /* no upload */
  return CURLE_OK;
}